

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall
icu_63::RBBITableBuilder::calcChainedFollowPos(RBBITableBuilder *this,RBBINode *tree)

{
  UVector *this_00;
  UBool UVar1;
  UChar32 c;
  int32_t iVar2;
  void *pvVar3;
  void *obj;
  int *piVar4;
  int j;
  int iVar5;
  int iVar6;
  UVector matchStartNodes;
  UVector ruleRootNodes;
  UVector leafNodes;
  UVector endMarkerNodes;
  
  UVector::UVector(&endMarkerNodes,this->fStatus);
  UVector::UVector(&leafNodes,this->fStatus);
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    RBBINode::findNodes(tree,&endMarkerNodes,endMark,this->fStatus);
    RBBINode::findNodes(tree,&leafNodes,leafChar,this->fStatus);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      UVector::UVector(&ruleRootNodes,this->fStatus);
      addRuleRootNodes(this,&ruleRootNodes,tree);
      UVector::UVector(&matchStartNodes,this->fStatus);
      for (iVar5 = 0; iVar5 < ruleRootNodes.count; iVar5 = iVar5 + 1) {
        pvVar3 = UVector::elementAt(&ruleRootNodes,iVar5);
        if (*(char *)((long)pvVar3 + 0x82) != '\0') {
          setAdd(this,&matchStartNodes,*(UVector **)((long)pvVar3 + 0x88));
        }
      }
      if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
        for (iVar5 = 0; iVar5 < leafNodes.count; iVar5 = iVar5 + 1) {
          pvVar3 = UVector::elementAt(&leafNodes,iVar5);
          iVar6 = 0;
          do {
            if (endMarkerNodes.count <= iVar6) goto LAB_0029eb6d;
            this_00 = *(UVector **)((long)pvVar3 + 0x98);
            obj = UVector::elementAt(&endMarkerNodes,iVar6);
            UVar1 = UVector::contains(this_00,obj);
            iVar6 = iVar6 + 1;
          } while (UVar1 == '\0');
          if (this->fRB->fLBCMNoChain == '\0') {
LAB_0029eb74:
            for (iVar6 = 0; iVar6 < matchStartNodes.count; iVar6 = iVar6 + 1) {
              piVar4 = (int *)UVector::elementAt(&matchStartNodes,iVar6);
              if ((*piVar4 == 3) && (*(int *)((long)pvVar3 + 0x7c) == piVar4[0x1f])) {
                setAdd(this,*(UVector **)((long)pvVar3 + 0x98),*(UVector **)(piVar4 + 0x26));
              }
            }
          }
          else {
            c = RBBISetBuilder::getFirstChar
                          (this->fRB->fSetBuilder,*(int32_t *)((long)pvVar3 + 0x7c));
            if (c == -1) goto LAB_0029eb74;
            iVar2 = u_getIntPropertyValue_63(c,UCHAR_LINE_BREAK);
            if (iVar2 != 9) goto LAB_0029eb74;
          }
LAB_0029eb6d:
        }
      }
      UVector::~UVector(&matchStartNodes);
      UVector::~UVector(&ruleRootNodes);
    }
  }
  UVector::~UVector(&leafNodes);
  UVector::~UVector(&endMarkerNodes);
  return;
}

Assistant:

void RBBITableBuilder::calcChainedFollowPos(RBBINode *tree) {

    UVector         endMarkerNodes(*fStatus);
    UVector         leafNodes(*fStatus);
    int32_t         i;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // get a list of all endmarker nodes.
    tree->findNodes(&endMarkerNodes, RBBINode::endMark, *fStatus);

    // get a list all leaf nodes
    tree->findNodes(&leafNodes, RBBINode::leafChar, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }

    // Collect all leaf nodes that can start matches for rules
    // with inbound chaining enabled, which is the union of the 
    // firstPosition sets from each of the rule root nodes.
    
    UVector ruleRootNodes(*fStatus);
    addRuleRootNodes(&ruleRootNodes, tree);

    UVector matchStartNodes(*fStatus);
    for (int j=0; j<ruleRootNodes.size(); ++j) {
        RBBINode *node = static_cast<RBBINode *>(ruleRootNodes.elementAt(j));
        if (node->fChainIn) {
            setAdd(&matchStartNodes, node->fFirstPosSet);
        }
    }
    if (U_FAILURE(*fStatus)) {
        return;
    }

    int32_t  endNodeIx;
    int32_t  startNodeIx;

    for (endNodeIx=0; endNodeIx<leafNodes.size(); endNodeIx++) {
        RBBINode *tNode   = (RBBINode *)leafNodes.elementAt(endNodeIx);
        RBBINode *endNode = NULL;

        // Identify leaf nodes that correspond to overall rule match positions.
        //   These include an endMarkerNode in their followPos sets.
        for (i=0; i<endMarkerNodes.size(); i++) {
            if (tNode->fFollowPos->contains(endMarkerNodes.elementAt(i))) {
                endNode = tNode;
                break;
            }
        }
        if (endNode == NULL) {
            // node wasn't an end node.  Try again with the next.
            continue;
        }

        // We've got a node that can end a match.

        // Line Break Specific hack:  If this node's val correspond to the $CM char class,
        //                            don't chain from it.
        // TODO:  Add rule syntax for this behavior, get specifics out of here and
        //        into the rule file.
        if (fRB->fLBCMNoChain) {
            UChar32 c = this->fRB->fSetBuilder->getFirstChar(endNode->fVal);
            if (c != -1) {
                // c == -1 occurs with sets containing only the {eof} marker string.
                ULineBreak cLBProp = (ULineBreak)u_getIntPropertyValue(c, UCHAR_LINE_BREAK);
                if (cLBProp == U_LB_COMBINING_MARK) {
                    continue;
                }
            }
        }


        // Now iterate over the nodes that can start a match, looking for ones
        //   with the same char class as our ending node.
        RBBINode *startNode;
        for (startNodeIx = 0; startNodeIx<matchStartNodes.size(); startNodeIx++) {
            startNode = (RBBINode *)matchStartNodes.elementAt(startNodeIx);
            if (startNode->fType != RBBINode::leafChar) {
                continue;
            }

            if (endNode->fVal == startNode->fVal) {
                // The end val (character class) of one possible match is the
                //   same as the start of another.

                // Add all nodes from the followPos of the start node to the
                //  followPos set of the end node, which will have the effect of
                //  letting matches transition from a match state at endNode
                //  to the second char of a match starting with startNode.
                setAdd(endNode->fFollowPos, startNode->fFollowPos);
            }
        }
    }
}